

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraDasm_cpp.h
# Opt level: O3

void __thiscall
moira::Moira::dasmRtm<(moira::Instr)158,(moira::Mode)12,4>
          (Moira *this,StrWriter *str,u32 *addr,u16 op)

{
  int iVar1;
  long lVar2;
  char *pcVar3;
  char cVar4;
  
  cVar4 = 'r';
  lVar2 = 1;
  do {
    pcVar3 = str->ptr;
    str->ptr = pcVar3 + 1;
    *pcVar3 = cVar4;
    cVar4 = "rtm"[lVar2];
    lVar2 = lVar2 + 1;
  } while (lVar2 != 4);
  if ((str->style->syntax & ~MOIRA_MIT) == GNU) {
    pcVar3 = str->ptr;
    str->ptr = pcVar3 + 1;
    *pcVar3 = ' ';
  }
  else {
    iVar1 = (str->tab).raw;
    pcVar3 = str->ptr;
    do {
      str->ptr = pcVar3 + 1;
      *pcVar3 = ' ';
      pcVar3 = str->ptr;
    } while (pcVar3 < str->base + iVar1);
  }
  StrWriter::operator<<(str,(Rn)(op & 0xf));
  if ((str->style->syntax & ~MOIRA_MIT) != GNU) {
    cVar4 = ';';
    lVar2 = 1;
    do {
      pcVar3 = str->ptr;
      str->ptr = pcVar3 + 1;
      *pcVar3 = cVar4;
      cVar4 = "rtm     %c%d; (2)"[lVar2 + 0xc];
      lVar2 = lVar2 + 1;
    } while (lVar2 != 6);
  }
  return;
}

Assistant:

void
Moira::dasmRtm(StrWriter &str, u32 &addr, u16 op) const
{
    auto src = Rn ( ____________xxxx(op) );

    str << Ins<I>{} << str.tab << src;
    str << Av<I, M, S>{};
}